

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BitMatrix.cpp
# Opt level: O0

bool __thiscall ZXing::BitMatrix::getBottomRightOnBit(BitMatrix *this,int *right,int *bottom)

{
  int iVar1;
  difference_type dVar2;
  int *in_RDX;
  int *in_RSI;
  int *in_RDI;
  int bitsOffset;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffffb8;
  undefined1 local_40 [8];
  reverse_iterator<__gnu_cxx::__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  *in_stack_ffffffffffffffc8;
  reverse_iterator<__gnu_cxx::__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  *in_stack_ffffffffffffffd0;
  
  iVar1 = Size<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  iVar1 = iVar1 + -1;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::rbegin(in_stack_ffffffffffffffb8);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::rbegin(in_stack_ffffffffffffffb8);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::rend(in_stack_ffffffffffffffb8);
  std::
  find_if<std::reverse_iterator<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,ZXing::__0>
            (&stack0xffffffffffffffc8,local_40,&stack0xffffffffffffffb8);
  dVar2 = std::
          distance<std::reverse_iterator<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
                    (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  iVar1 = iVar1 - (int)dVar2;
  if (-1 < iVar1) {
    *in_RDX = iVar1 / *in_RDI;
    *in_RSI = iVar1 % *in_RDI;
  }
  return -1 < iVar1;
}

Assistant:

bool
BitMatrix::getBottomRightOnBit(int& right, int& bottom) const
{
	int bitsOffset = Size(_bits) - 1 - (int)std::distance(_bits.rbegin(), std::find_if(_bits.rbegin(), _bits.rend(), isSet));
	if (bitsOffset < 0) {
		return false;
	}

	bottom = bitsOffset / _width;
	right = (bitsOffset % _width);
	return true;
}